

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O2

void __thiscall leveldb::TableCache::~TableCache(TableCache *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->cache_ != (Cache *)0x0) {
    (*this->cache_->_vptr_Cache[1])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::~string((string *)&this->dbname_);
    return;
  }
  __stack_chk_fail();
}

Assistant:

TableCache::~TableCache() { delete cache_; }